

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

void uv_pipe_connect(uv_connect_t *req,uv_pipe_t *handle,char *name,uv_connect_cb cb)

{
  anon_union_16_2_bf76bca6_for_active_reqs *paVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  sockaddr_un saddr;
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  
  iVar2 = (handle->io_watcher).fd;
  if (iVar2 == -1) {
    iVar3 = uv__socket(1,1,0);
    if (iVar3 < 0) goto LAB_004ca40a;
    (handle->io_watcher).fd = iVar3;
  }
  uStack_48 = 0;
  uStack_42 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_4a = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.sa_family = 0;
  local_a8.sa_data[0] = '\0';
  local_a8.sa_data[1] = '\0';
  local_a8.sa_data[2] = '\0';
  local_a8.sa_data[3] = '\0';
  local_a8.sa_data[4] = '\0';
  local_a8.sa_data[5] = '\0';
  local_a8.sa_data[6] = '\0';
  local_a8.sa_data[7] = '\0';
  local_a8.sa_data[8] = '\0';
  local_a8.sa_data[9] = '\0';
  local_a8.sa_data[10] = '\0';
  local_a8.sa_data[0xb] = '\0';
  local_a8.sa_data[0xc] = '\0';
  local_a8.sa_data[0xd] = '\0';
  uv__strscpy(local_a8.sa_data,name,0x6c);
  local_a8.sa_family = 1;
  do {
    iVar3 = connect((handle->io_watcher).fd,&local_a8,0x6e);
    if (iVar3 != -1) goto LAB_004ca3d2;
    piVar4 = __errno_location();
    iVar3 = *piVar4;
  } while (iVar3 == 4);
  if (iVar3 == 0x73) {
LAB_004ca3d2:
    iVar3 = 0;
    if (iVar2 == -1) {
      iVar3 = uv__stream_open((uv_stream_t *)handle,(handle->io_watcher).fd,0xc000);
    }
    if (iVar3 == 0) {
      uv__io_start(handle->loop,&handle->io_watcher,4);
      iVar3 = 0;
    }
  }
  else {
    iVar3 = -iVar3;
  }
LAB_004ca40a:
  handle->delayed_error = iVar3;
  handle->connect_req = req;
  req->type = UV_CONNECT;
  paVar1 = &handle->loop->active_reqs;
  paVar1->count = paVar1->count + 1;
  req->handle = (uv_stream_t *)handle;
  req->cb = cb;
  req->queue[0] = req->queue;
  req->queue[1] = req->queue;
  if (iVar3 != 0) {
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return;
}

Assistant:

void uv_pipe_connect(uv_connect_t* req,
                    uv_pipe_t* handle,
                    const char* name,
                    uv_connect_cb cb) {
  struct sockaddr_un saddr;
  int new_sock;
  int err;
  int r;

  new_sock = (uv__stream_fd(handle) == -1);

  if (new_sock) {
    err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
    if (err < 0)
      goto out;
    handle->io_watcher.fd = err;
  }

  memset(&saddr, 0, sizeof saddr);
  uv__strscpy(saddr.sun_path, name, sizeof(saddr.sun_path));
  saddr.sun_family = AF_UNIX;

  do {
    r = connect(uv__stream_fd(handle),
                (struct sockaddr*)&saddr, sizeof saddr);
  }
  while (r == -1 && errno == EINTR);

  if (r == -1 && errno != EINPROGRESS) {
    err = UV__ERR(errno);
#if defined(__CYGWIN__) || defined(__MSYS__)
    /* EBADF is supposed to mean that the socket fd is bad, but
       Cygwin reports EBADF instead of ENOTSOCK when the file is
       not a socket.  We do not expect to see a bad fd here
       (e.g. due to new_sock), so translate the error.  */
    if (err == UV_EBADF)
      err = UV_ENOTSOCK;
#endif
    goto out;
  }

  err = 0;
  if (new_sock) {
    err = uv__stream_open((uv_stream_t*)handle,
                          uv__stream_fd(handle),
                          UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
  }

  if (err == 0)
    uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

out:
  handle->delayed_error = err;
  handle->connect_req = req;

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->handle = (uv_stream_t*)handle;
  req->cb = cb;
  QUEUE_INIT(&req->queue);

  /* Force callback to run on next tick in case of error. */
  if (err)
    uv__io_feed(handle->loop, &handle->io_watcher);

}